

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopWatch.h
# Opt level: O3

unsigned_long_long StopWatch::current(Precision prec)

{
  unsigned_long_long uVar1;
  timeval t;
  timeval local_20;
  
  Rct::gettime(&local_20);
  if (prec == Millisecond) {
    uVar1 = local_20.tv_usec / 1000 + local_20.tv_sec * 1000;
  }
  else {
    uVar1 = local_20.tv_sec * 1000000 + local_20.tv_usec;
  }
  return uVar1;
}

Assistant:

static unsigned long long current(Precision prec)
    {
        timeval t;
        Rct::gettime(&t); // monotonic
        if (prec == Millisecond) {
            return (t.tv_sec * 1000) + (t.tv_usec / 1000);
        } else {
            return (t.tv_sec * 1000000) + t.tv_usec;
        }
    }